

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall trackerboy::apu::Mixer::clear(Mixer *this)

{
  this->mSampleOffset = 0.0;
  this->mWriteIndex = 0;
  (this->mAccumulators)._M_elems[0].sum = 0.0;
  (this->mAccumulators)._M_elems[0].highpass = 0.0;
  (this->mAccumulators)._M_elems[1].sum = 0.0;
  (this->mAccumulators)._M_elems[1].highpass = 0.0;
  std::__fill_n_a<float*,unsigned_long,float>
            ((this->mBuffer)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl,this->mBuffersize);
  return;
}

Assistant:

void Mixer::clear() {
    mSampleOffset = 0.0f;
    mWriteIndex = 0;
    for (auto &accum : mAccumulators) {
        accum.reset();
    }
    std::fill_n(mBuffer.get(), mBuffersize, 0.0f);
}